

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2int8.cpp
# Opt level: O0

int __thiscall NetQuantize::quantize_convolutiondepthwise(NetQuantize *this)

{
  long *plVar1;
  pointer pMVar2;
  value_type pLVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  FILE *__stream;
  Allocator *pAVar11;
  bool bVar12;
  size_type sVar13;
  undefined8 uVar14;
  reference ppLVar15;
  pointer ppVar16;
  pointer *ppiVar17;
  size_type *psVar18;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar19;
  Mat *dst;
  Mat *in_RDI;
  Mat weight_data_int8_scales_g;
  Mat int8_weight_data_g;
  Mat weight_data_g;
  Option opt_q;
  int g;
  int weight_data_size_g;
  Mat int8_weight_data;
  Mat weight_data_int8_scales;
  Mat bottom_blob_int8_scales;
  ConvolutionDepthWise *convdw;
  iterator iter;
  char key [256];
  iterator iter_data;
  int i;
  int layer_count;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  *in_stack_fffffffffffff7f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff800;
  Allocator *in_stack_fffffffffffff808;
  Mat *in_stack_fffffffffffff810;
  void **in_stack_fffffffffffff818;
  int _w;
  Mat *in_stack_fffffffffffff820;
  bool local_749;
  Option *opt;
  int *piVar20;
  void *local_6a0;
  int *local_698;
  long local_690;
  undefined4 local_688;
  long *local_680;
  undefined4 local_678;
  int local_674;
  undefined4 local_670;
  undefined4 local_66c;
  undefined4 local_668;
  long local_660;
  pointer local_658;
  int *local_650;
  pointer local_648;
  undefined4 local_640;
  pointer local_638;
  undefined4 local_630;
  int local_62c;
  undefined4 local_628;
  undefined4 local_624;
  undefined4 local_620;
  long local_618;
  undefined1 local_610 [8];
  long *local_608;
  undefined1 local_5e9;
  int local_5cc;
  int local_5c8;
  int local_5c4;
  void *local_5c0;
  int *local_5b8;
  long local_5b0;
  undefined4 local_5a8;
  long *local_5a0;
  undefined4 local_598;
  undefined4 local_594;
  undefined4 local_590;
  undefined4 local_58c;
  int local_588;
  long local_580;
  void *local_578;
  int *local_570;
  size_t local_568;
  int local_560;
  Allocator *local_558;
  int local_550;
  int local_54c;
  int local_548;
  int local_544;
  int local_540;
  size_t local_538;
  Mat local_530;
  value_type local_4e8;
  _Self local_4e0 [3];
  allocator local_4c1;
  string local_4c0 [32];
  _Self local_4a0;
  char local_498 [256];
  _Self local_398;
  _Self local_390;
  int local_388;
  int local_384;
  int local_374;
  undefined1 *local_370;
  void **local_360;
  pointer *local_350;
  void **local_340;
  void **local_330;
  Mat *local_320;
  int local_310;
  undefined4 local_30c;
  Mat *local_308;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_300;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_2f8;
  int local_2f0;
  undefined4 local_2ec;
  void **local_2e8;
  size_type *local_2e0;
  size_type *local_2d8;
  int local_2d0;
  undefined4 local_2cc;
  void **local_2c8;
  pointer *local_2c0;
  pointer *local_2b8;
  void **local_2b0;
  Mat *local_2a8;
  Mat *local_2a0;
  Mat *local_298;
  void **local_290;
  undefined8 local_288;
  undefined8 local_280;
  undefined4 local_274;
  void **local_270;
  undefined4 local_268;
  int local_264;
  void **local_260;
  undefined1 *local_258;
  int local_250;
  int local_24c;
  void **local_248;
  void **local_240;
  int local_238;
  int local_234;
  pointer *local_230;
  pointer *local_228;
  int local_220;
  undefined4 local_21c;
  pointer *local_218;
  int local_210;
  undefined4 local_20c;
  size_type *local_208;
  int local_200;
  undefined4 local_1fc;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_1f8;
  int local_1e0;
  undefined4 local_1dc;
  Mat *local_1d8;
  int local_1c0;
  undefined4 local_1bc;
  void **local_1b8;
  int local_1a0;
  undefined4 local_19c;
  void **local_198;
  int local_180;
  undefined4 local_17c;
  pointer *local_178;
  int local_160;
  undefined4 local_15c;
  void **local_158;
  int local_140;
  undefined4 local_13c;
  undefined1 *local_138;
  void *local_120;
  pointer local_110;
  void *local_100;
  void *local_f0;
  void *local_e0;
  pointer local_d0;
  void *local_c8;
  pointer local_c0;
  void **local_b8;
  int local_b0;
  undefined4 local_ac;
  void **local_a8;
  int local_a0;
  undefined4 local_9c;
  Mat *local_98;
  pointer local_90;
  undefined4 local_84;
  pointer local_80;
  pointer local_78;
  int local_6c;
  pointer *local_68;
  undefined4 local_54;
  long local_50;
  void *local_48;
  int local_3c;
  void **local_38;
  Allocator *local_30;
  int local_24;
  size_t local_20;
  Mat *local_18;
  undefined4 local_c;
  undefined1 *local_8;
  
  sVar13 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                     ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)in_RDI[1].elemsize);
  local_384 = (int)sVar13;
  local_388 = 0;
  do {
    if (local_384 <= local_388) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)in_RDI[1].elemsize,
               (long)local_388);
    bVar12 = std::operator!=(in_stack_fffffffffffff800,(char *)in_stack_fffffffffffff7f8);
    if (!bVar12) {
      opt = (Option *)&in_RDI[1].h;
      std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)in_RDI[1].elemsize,
                 (long)local_388);
      local_390._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
           ::find(in_stack_fffffffffffff7f8,(key_type *)0x1816e1);
      local_398._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
           ::end(in_stack_fffffffffffff7f8);
      bVar12 = std::operator==(&local_390,&local_398);
      _w = (int)((ulong)in_stack_fffffffffffff818 >> 0x20);
      if (!bVar12) {
        std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                  ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)in_RDI[1].elemsize,
                   (long)local_388);
        uVar14 = std::__cxx11::string::c_str();
        sprintf(local_498,"%s_param_0",uVar14);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_4c0,local_498,&local_4c1);
        local_4a0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
             ::find(in_stack_fffffffffffff7f8,(key_type *)0x1817c7);
        std::__cxx11::string::~string(local_4c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
        local_4e0[0]._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
             ::end(in_stack_fffffffffffff7f8);
        bVar12 = std::operator==(&local_4a0,local_4e0);
        if (bVar12) {
          fprintf(_stderr,"this layer need to be quantized, but no scale param!\n");
          return -1;
        }
        ppLVar15 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                             ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                              in_RDI[1].elemsize,(long)local_388);
        local_4e8 = *ppLVar15;
        ppVar16 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>
                  ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>
                                *)0x1818d4);
        local_2a8 = &ppVar16->second;
        local_2a0 = &local_530;
        local_530.data = local_2a8->data;
        local_530.refcount = (ppVar16->second).refcount;
        local_530.elemsize = (ppVar16->second).elemsize;
        local_530.elempack = (ppVar16->second).elempack;
        local_530.allocator = (ppVar16->second).allocator;
        local_530.dims = (ppVar16->second).dims;
        local_530.w = (ppVar16->second).w;
        local_530.h = (ppVar16->second).h;
        local_530.d = (ppVar16->second).d;
        local_530.c = (ppVar16->second).c;
        local_530.cstep = (ppVar16->second).cstep;
        if (local_530.refcount != (int *)0x0) {
          local_9c = 1;
          LOCK();
          local_a0 = *local_530.refcount;
          *local_530.refcount = *local_530.refcount + 1;
          UNLOCK();
        }
        local_98 = local_2a0;
        ppVar16 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>
                  ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>
                                *)0x1819f7);
        local_298 = &ppVar16->second;
        local_290 = &local_578;
        local_578 = local_298->data;
        local_570 = (ppVar16->second).refcount;
        local_568 = (ppVar16->second).elemsize;
        local_560 = (ppVar16->second).elempack;
        local_558 = (ppVar16->second).allocator;
        local_550 = (ppVar16->second).dims;
        local_54c = (ppVar16->second).w;
        local_548 = (ppVar16->second).h;
        local_544 = (ppVar16->second).d;
        local_540 = (ppVar16->second).c;
        local_538 = (ppVar16->second).cstep;
        if (local_570 != (int *)0x0) {
          local_ac = 1;
          LOCK();
          local_b0 = *local_570;
          *local_570 = *local_570 + 1;
          UNLOCK();
        }
        __stream = _stderr;
        local_a8 = local_290;
        uVar14 = std::__cxx11::string::c_str();
        fprintf(__stream,"quantize_convolutiondepthwise %s\n",uVar14);
        local_274 = *(undefined4 *)&local_4e8[1].type.field_0x4;
        local_270 = &local_5c0;
        local_280 = 1;
        local_288 = 0;
        local_5c0 = (void *)0x0;
        local_5b8 = (int *)0x0;
        local_5b0 = 0;
        local_5a8 = 0;
        local_5a0 = (long *)0x0;
        local_598 = 0;
        local_594 = 0;
        local_590 = 0;
        local_58c = 0;
        local_588 = 0;
        local_580 = 0;
        ncnn::Mat::create(in_stack_fffffffffffff820,_w,(size_t)in_stack_fffffffffffff810,
                          in_stack_fffffffffffff808);
        local_2b0 = &local_5c0;
        if (local_5c0 != (void *)0x0) {
          local_b8 = local_2b0;
        }
        local_749 = local_5c0 != (void *)0x0 && local_580 * local_588 != 0;
        if (local_749) {
          local_5c8 = *(int *)&local_4e8[1].type.field_0x4 / (int)local_4e8[1].type._M_string_length
          ;
          for (local_5cc = 0; pLVar3 = local_4e8,
              local_5cc < (int)local_4e8[1].type._M_string_length; local_5cc = local_5cc + 1) {
            memcpy(local_610,&in_RDI->refcount,0x40);
            pAVar11 = local_558;
            local_608 = local_5a0;
            local_5e9 = 0;
            local_230 = &local_4e8[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
            local_234 = local_5c8 * local_5cc;
            local_228 = &local_658;
            local_238 = local_5c8;
            local_78 = (pointer)((long)*local_230 +
                                (long)local_234 *
                                (long)local_4e8[1].bottom_shapes.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_finish);
            local_80 = local_4e8[1].bottom_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            local_84 = *(undefined4 *)
                        &local_4e8[1].bottom_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
            local_90 = local_4e8[1].top_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_start;
            local_68 = &local_658;
            local_6c = local_5c8;
            local_650 = (int *)0x0;
            local_630 = 1;
            local_62c = local_5c8;
            local_628 = 1;
            local_624 = 1;
            local_620 = 1;
            local_618 = (long)local_5c8;
            local_24c = local_5c8 * local_5cc;
            local_240 = &local_6a0;
            local_248 = &local_5c0;
            local_250 = local_5c8;
            local_48 = (void *)((long)local_5c0 + local_24c * local_5b0);
            local_50 = local_5b0;
            local_54 = local_5a8;
            local_38 = &local_6a0;
            local_3c = local_5c8;
            local_698 = (int *)0x0;
            local_690 = local_5b0;
            local_688 = local_5a8;
            local_680 = local_5a0;
            local_678 = 1;
            local_674 = local_5c8;
            local_670 = 1;
            local_66c = 1;
            local_668 = 1;
            local_660 = (long)local_5c8;
            local_258 = &stack0xfffffffffffff918;
            local_260 = &local_578;
            local_264 = local_5cc;
            local_268 = 1;
            dst = (Mat *)((long)local_578 + (long)local_5cc * local_568);
            local_20 = local_568;
            local_24 = local_560;
            local_30 = local_558;
            local_8 = &stack0xfffffffffffff918;
            local_c = 1;
            piVar20 = (int *)0x0;
            local_18 = dst;
            local_6a0 = local_48;
            local_658 = local_78;
            local_648 = local_80;
            local_640 = local_84;
            local_638 = local_90;
            ncnn::quantize_to_int8((Mat *)0x0,dst,in_RDI,opt);
            local_370 = &stack0xfffffffffffff918;
            local_138 = local_370;
            if (piVar20 != (int *)0x0) {
              local_13c = 0xffffffff;
              LOCK();
              local_140 = *piVar20;
              *piVar20 = *piVar20 + -1;
              UNLOCK();
              if (local_140 == 1) {
                if (pAVar11 == (Allocator *)0x0) {
                  if (dst != (Mat *)0x0) {
                    free(dst);
                  }
                }
                else {
                  (*pAVar11->_vptr_Allocator[3])(pAVar11,dst);
                }
              }
            }
            local_360 = &local_6a0;
            local_158 = local_360;
            if (local_698 != (int *)0x0) {
              local_15c = 0xffffffff;
              LOCK();
              local_160 = *local_698;
              *local_698 = *local_698 + -1;
              UNLOCK();
              if (local_160 == 1) {
                if (local_680 == (long *)0x0) {
                  local_120 = local_6a0;
                  if (local_6a0 != (void *)0x0) {
                    free(local_6a0);
                  }
                }
                else {
                  (**(code **)(*local_680 + 0x18))(local_680,local_6a0);
                }
              }
            }
            local_6a0 = (void *)0x0;
            local_690 = 0;
            local_688 = 0;
            local_678 = 0;
            local_674 = 0;
            local_670 = 0;
            local_66c = 0;
            local_668 = 0;
            local_660 = 0;
            local_698 = (int *)0x0;
            local_350 = &local_658;
            local_178 = local_350;
            if (local_650 != (int *)0x0) {
              local_17c = 0xffffffff;
              LOCK();
              local_180 = *local_650;
              *local_650 = *local_650 + -1;
              UNLOCK();
              if (local_180 == 1) {
                if (local_638 == (pointer)0x0) {
                  local_110 = local_658;
                  if (local_658 != (pointer)0x0) {
                    free(local_658);
                  }
                }
                else {
                  (**(code **)((long)local_638->data + 0x18))(local_638,local_658);
                }
              }
            }
            local_658 = (pointer)0x0;
            local_648 = (pointer)0x0;
            local_640 = 0;
            local_630 = 0;
            local_62c = 0;
            local_628 = 0;
            local_624 = 0;
            local_620 = 0;
            local_618 = 0;
            local_650 = (int *)0x0;
          }
          ppiVar17 = &local_4e8[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          local_2c8 = &local_5c0;
          local_2c0 = ppiVar17;
          if (ppiVar17 != (pointer *)local_2c8) {
            if (local_5b8 != (int *)0x0) {
              local_2cc = 1;
              LOCK();
              local_2d0 = *local_5b8;
              *local_5b8 = *local_5b8 + 1;
              UNLOCK();
            }
            local_218 = ppiVar17;
            if (local_4e8[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              pMVar2 = local_4e8[1].bottom_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_start;
              local_21c = 0xffffffff;
              LOCK();
              local_220 = *(int *)&pMVar2->data;
              *(int *)&pMVar2->data = *(int *)&pMVar2->data + -1;
              UNLOCK();
              if (local_220 == 1) {
                if (local_4e8[1].top_shapes.
                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start == (pointer)0x0) {
                  local_c0 = *ppiVar17;
                  if (local_c0 != (pointer)0x0) {
                    free(local_c0);
                  }
                }
                else {
                  pMVar2 = local_4e8[1].top_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  (**(code **)((long)pMVar2->data + 0x18))(pMVar2,*ppiVar17);
                }
              }
            }
            *ppiVar17 = (pointer)0x0;
            pLVar3[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            *(undefined4 *)
             &pLVar3[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = 0;
            *(undefined4 *)
             &pLVar3[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
              .super__Vector_impl_data._M_finish = 0;
            *(undefined4 *)
             ((long)&pLVar3[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
            *(undefined4 *)
             &pLVar3[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage = 0;
            *(undefined4 *)
             ((long)&pLVar3[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
            *(undefined4 *)&pLVar3[2]._vptr_Layer = 0;
            pLVar3[2].one_blob_only = false;
            pLVar3[2].support_inplace = false;
            pLVar3[2].support_vulkan = false;
            pLVar3[2].support_packing = false;
            pLVar3[2].support_bf16_storage = false;
            pLVar3[2].support_fp16_storage = false;
            pLVar3[2].support_int8_storage = false;
            pLVar3[2].support_image_storage = false;
            pLVar3[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            *ppiVar17 = (pointer)*local_2c8;
            pLVar3[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)local_2c8[1];
            pLVar3[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)local_2c8[2];
            *(undefined4 *)
             &pLVar3[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = *(undefined4 *)(local_2c8 + 3);
            pLVar3[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_2c8[4];
            *(undefined4 *)
             &pLVar3[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
              .super__Vector_impl_data._M_finish = *(undefined4 *)(local_2c8 + 5);
            *(undefined4 *)
             ((long)&pLVar3[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 4) =
                 *(undefined4 *)((long)local_2c8 + 0x2c);
            *(undefined4 *)
             &pLVar3[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage = *(undefined4 *)(local_2c8 + 6);
            *(undefined4 *)
             ((long)&pLVar3[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4) =
                 *(undefined4 *)((long)local_2c8 + 0x34);
            *(undefined4 *)&pLVar3[2]._vptr_Layer = *(undefined4 *)(local_2c8 + 7);
            *(void **)&pLVar3[2].one_blob_only = local_2c8[8];
          }
          local_5c4 = 0;
          local_2b8 = ppiVar17;
        }
        else {
          local_374 = -100;
          local_5c4 = 1;
        }
        local_340 = &local_5c0;
        local_198 = local_340;
        if (local_5b8 != (int *)0x0) {
          local_19c = 0xffffffff;
          LOCK();
          local_1a0 = *local_5b8;
          *local_5b8 = *local_5b8 + -1;
          UNLOCK();
          if (local_1a0 == 1) {
            if (local_5a0 == (long *)0x0) {
              local_100 = local_5c0;
              if (local_5c0 != (void *)0x0) {
                free(local_5c0);
              }
            }
            else {
              (**(code **)(*local_5a0 + 0x18))(local_5a0,local_5c0);
            }
          }
        }
        pLVar3 = local_4e8;
        local_5c0 = (void *)0x0;
        local_5b0 = 0;
        local_5a8 = 0;
        local_598 = 0;
        local_594 = 0;
        local_590 = 0;
        local_58c = 0;
        local_588 = 0;
        local_580 = 0;
        local_5b8 = (int *)0x0;
        if (local_5c4 == 0) {
          *(undefined4 *)((long)&local_4e8[1].type._M_string_length + 4) = 1;
          psVar18 = &local_4e8[2].name._M_string_length;
          local_2e8 = &local_578;
          local_2e0 = psVar18;
          if ((void **)psVar18 != local_2e8) {
            if (local_570 != (int *)0x0) {
              local_2ec = 1;
              LOCK();
              local_2f0 = *local_570;
              *local_570 = *local_570 + 1;
              UNLOCK();
            }
            local_208 = psVar18;
            if (local_4e8[2].name.field_2._M_allocated_capacity != 0) {
              piVar20 = *(int **)&local_4e8[2].name.field_2;
              local_20c = 0xffffffff;
              LOCK();
              local_210 = *piVar20;
              *piVar20 = *piVar20 + -1;
              UNLOCK();
              if (local_210 == 1) {
                if (local_4e8[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish == (pointer)0x0) {
                  local_c8 = (void *)*psVar18;
                  if (local_c8 != (void *)0x0) {
                    free(local_c8);
                  }
                }
                else {
                  plVar1 = (long *)local_4e8[2].bottoms.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish;
                  (**(code **)(*plVar1 + 0x18))(plVar1,*psVar18);
                }
              }
            }
            *psVar18 = 0;
            *(undefined8 *)((long)&pLVar3[2].name.field_2 + 8) = 0;
            *(undefined4 *)
             &pLVar3[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = 0;
            *(undefined4 *)
             &pLVar3[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = 0;
            *(undefined4 *)
             ((long)&pLVar3[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4) = 0;
            *(undefined4 *)
             &pLVar3[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = 0;
            *(undefined4 *)
             ((long)&pLVar3[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + 4) = 0;
            *(undefined4 *)
             &pLVar3[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = 0;
            pLVar3[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pLVar3[2].name.field_2._M_allocated_capacity = 0;
            *psVar18 = (size_type)*local_2e8;
            pLVar3[2].name.field_2._M_allocated_capacity = (size_type)local_2e8[1];
            *(void **)((long)&pLVar3[2].name.field_2 + 8) = local_2e8[2];
            *(undefined4 *)
             &pLVar3[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = *(undefined4 *)(local_2e8 + 3);
            pLVar3[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)local_2e8[4];
            *(undefined4 *)
             &pLVar3[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = *(undefined4 *)(local_2e8 + 5);
            *(undefined4 *)
             ((long)&pLVar3[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4) =
                 *(undefined4 *)((long)local_2e8 + 0x2c);
            *(undefined4 *)
             &pLVar3[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = *(undefined4 *)(local_2e8 + 6);
            *(undefined4 *)
             ((long)&pLVar3[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + 4) = *(undefined4 *)((long)local_2e8 + 0x34)
            ;
            *(undefined4 *)
             &pLVar3[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = *(undefined4 *)(local_2e8 + 7);
            pLVar3[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)local_2e8[8];
          }
          pLVar3 = local_4e8;
          pvVar19 = &local_4e8[2].bottom_shapes;
          local_308 = &local_530;
          local_300 = pvVar19;
          local_2d8 = psVar18;
          if ((Mat *)pvVar19 != local_308) {
            if (local_530.refcount != (int *)0x0) {
              local_30c = 1;
              LOCK();
              local_310 = *local_530.refcount;
              *local_530.refcount = *local_530.refcount + 1;
              UNLOCK();
            }
            in_stack_fffffffffffff820 = (Mat *)pvVar19;
            local_1f8 = pvVar19;
            if (local_4e8[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
              pMVar2 = local_4e8[2].bottom_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              local_1fc = 0xffffffff;
              LOCK();
              local_200 = *(int *)&pMVar2->data;
              *(int *)&pMVar2->data = *(int *)&pMVar2->data + -1;
              UNLOCK();
              if (local_200 == 1) {
                if (local_4e8[2].top_shapes.
                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_finish == (pointer)0x0) {
                  local_d0 = (pvVar19->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                             _M_impl.super__Vector_impl_data._M_start;
                  if (local_d0 != (pointer)0x0) {
                    free(local_d0);
                  }
                }
                else {
                  pMVar2 = local_4e8[2].top_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                  (**(code **)((long)pMVar2->data + 0x18))
                            (pMVar2,(pvVar19->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_start);
                }
              }
            }
            (((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
             &in_stack_fffffffffffff820->data)->_M_impl).super__Vector_impl_data._M_start =
                 (pointer)0x0;
            in_stack_fffffffffffff820->elemsize = 0;
            *(undefined4 *)
             &(((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
               &in_stack_fffffffffffff820->elempack)->
              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start = 0;
            in_stack_fffffffffffff820->dims = 0;
            in_stack_fffffffffffff820->w = 0;
            in_stack_fffffffffffff820->h = 0;
            in_stack_fffffffffffff820->d = 0;
            in_stack_fffffffffffff820->c = 0;
            in_stack_fffffffffffff820->cstep = 0;
            in_stack_fffffffffffff820->refcount = (int *)0x0;
            (pvVar19->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_308->data;
            pLVar3[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)local_308->refcount;
            pLVar3[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_308->elemsize;
            *(int *)&pLVar3[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start = local_308->elempack;
            pLVar3[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)local_308->allocator;
            *(int *)&pLVar3[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage = local_308->dims;
            *(int *)((long)&pLVar3[2].top_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 4) = local_308->w;
            *(int *)&pLVar3[3]._vptr_Layer = local_308->h;
            *(int *)((long)&pLVar3[3]._vptr_Layer + 4) = local_308->d;
            uVar4 = *(undefined1 *)((long)&local_308->c + 1);
            uVar5 = *(undefined1 *)((long)&local_308->c + 2);
            uVar6 = *(undefined1 *)((long)&local_308->c + 3);
            pLVar3[3].one_blob_only = (bool)*(undefined1 *)&local_308->c;
            pLVar3[3].support_inplace = (bool)uVar4;
            pLVar3[3].support_vulkan = (bool)uVar5;
            pLVar3[3].support_packing = (bool)uVar6;
            uVar4 = *(undefined1 *)((long)&local_308->cstep + 1);
            uVar5 = *(undefined1 *)((long)&local_308->cstep + 2);
            uVar6 = *(undefined1 *)((long)&local_308->cstep + 3);
            uVar7 = *(undefined1 *)((long)&local_308->cstep + 4);
            uVar8 = *(undefined1 *)((long)&local_308->cstep + 5);
            uVar9 = *(undefined1 *)((long)&local_308->cstep + 6);
            uVar10 = *(undefined1 *)((long)&local_308->cstep + 7);
            pLVar3[3].support_tensor_storage = (bool)*(undefined1 *)&local_308->cstep;
            pLVar3[3].support_reserved_00 = (bool)uVar4;
            pLVar3[3].support_reserved_0 = (bool)uVar5;
            pLVar3[3].support_reserved_1 = (bool)uVar6;
            pLVar3[3].support_reserved_2 = (bool)uVar7;
            pLVar3[3].support_reserved_3 = (bool)uVar8;
            pLVar3[3].support_reserved_4 = (bool)uVar9;
            pLVar3[3].support_reserved_5 = (bool)uVar10;
          }
          local_5c4 = 0;
          local_2f8 = pvVar19;
        }
        in_stack_fffffffffffff818 = &local_578;
        local_330 = in_stack_fffffffffffff818;
        local_1b8 = in_stack_fffffffffffff818;
        if (local_570 != (int *)0x0) {
          local_1bc = 0xffffffff;
          LOCK();
          local_1c0 = *local_570;
          *local_570 = *local_570 + -1;
          UNLOCK();
          if (local_1c0 == 1) {
            if (local_558 == (Allocator *)0x0) {
              local_f0 = local_578;
              if (local_578 != (void *)0x0) {
                free(local_578);
              }
            }
            else {
              (*local_558->_vptr_Allocator[3])(local_558,local_578);
            }
          }
        }
        *in_stack_fffffffffffff818 = (void *)0x0;
        in_stack_fffffffffffff818[2] = (void *)0x0;
        *(undefined4 *)(in_stack_fffffffffffff818 + 3) = 0;
        *(undefined4 *)(in_stack_fffffffffffff818 + 5) = 0;
        *(undefined4 *)((long)in_stack_fffffffffffff818 + 0x2c) = 0;
        *(undefined4 *)(in_stack_fffffffffffff818 + 6) = 0;
        *(undefined4 *)((long)in_stack_fffffffffffff818 + 0x34) = 0;
        *(undefined4 *)(in_stack_fffffffffffff818 + 7) = 0;
        in_stack_fffffffffffff818[8] = (void *)0x0;
        in_stack_fffffffffffff818[1] = (void *)0x0;
        in_stack_fffffffffffff810 = &local_530;
        local_320 = in_stack_fffffffffffff810;
        local_1d8 = in_stack_fffffffffffff810;
        if (local_530.refcount != (int *)0x0) {
          local_1dc = 0xffffffff;
          LOCK();
          local_1e0 = *local_530.refcount;
          *local_530.refcount = *local_530.refcount + -1;
          UNLOCK();
          if (local_1e0 == 1) {
            if (local_530.allocator == (Allocator *)0x0) {
              local_e0 = local_530.data;
              if (local_530.data != (void *)0x0) {
                free(local_530.data);
              }
            }
            else {
              (*(local_530.allocator)->_vptr_Allocator[3])(local_530.allocator,local_530.data);
            }
          }
        }
        in_stack_fffffffffffff810->data = (void *)0x0;
        in_stack_fffffffffffff810->elemsize = 0;
        in_stack_fffffffffffff810->elempack = 0;
        in_stack_fffffffffffff810->dims = 0;
        in_stack_fffffffffffff810->w = 0;
        in_stack_fffffffffffff810->h = 0;
        in_stack_fffffffffffff810->d = 0;
        in_stack_fffffffffffff810->c = 0;
        in_stack_fffffffffffff810->cstep = 0;
        in_stack_fffffffffffff810->refcount = (int *)0x0;
        if (local_5c4 != 0) {
          return local_374;
        }
      }
    }
    local_388 = local_388 + 1;
  } while( true );
}

Assistant:

int NetQuantize::quantize_convolutiondepthwise()
{
    const int layer_count = static_cast<int>(layers.size());
    for (int i = 0; i < layer_count; i++)
    {
        // find convolution layer
        if (layers[i]->type != "ConvolutionDepthWise")
            continue;

        // find convolutiondepthwise layer
        std::map<std::string, ncnn::Mat>::iterator iter_data = blob_int8scale_table.find(layers[i]->name);
        if (iter_data == blob_int8scale_table.end())
            continue;

        char key[256];
        sprintf(key, "%s_param_0", layers[i]->name.c_str());

        std::map<std::string, ncnn::Mat>::iterator iter = weight_int8scale_table.find(key);
        if (iter == weight_int8scale_table.end())
        {
            fprintf(stderr, "this layer need to be quantized, but no scale param!\n");
            return -1;
        }

        // Convolution - quantize weight from fp32 to int8
        ncnn::ConvolutionDepthWise* convdw = (ncnn::ConvolutionDepthWise*)layers[i];

        ncnn::Mat bottom_blob_int8_scales = iter_data->second;
        ncnn::Mat weight_data_int8_scales = iter->second;

        fprintf(stderr, "quantize_convolutiondepthwise %s\n", convdw->name.c_str());

        {
            ncnn::Mat int8_weight_data(convdw->weight_data_size, (size_t)1u);
            if (int8_weight_data.empty())
                return -100;

            const int weight_data_size_g = convdw->weight_data_size / convdw->group;

            for (int g = 0; g < convdw->group; g++)
            {
                ncnn::Option opt_q = opt;
                opt_q.blob_allocator = int8_weight_data.allocator;
                opt_q.use_packing_layout = false;

                const ncnn::Mat weight_data_g = convdw->weight_data.range(weight_data_size_g * g, weight_data_size_g);
                ncnn::Mat int8_weight_data_g = int8_weight_data.range(weight_data_size_g * g, weight_data_size_g);
                const ncnn::Mat weight_data_int8_scales_g = weight_data_int8_scales.range(g, 1);
                ncnn::quantize_to_int8(weight_data_g, int8_weight_data_g, weight_data_int8_scales_g, opt_q);
            }

            convdw->weight_data = int8_weight_data;
        }

        convdw->int8_scale_term = 1;
        convdw->weight_data_int8_scales = weight_data_int8_scales;
        convdw->bottom_blob_int8_scales = bottom_blob_int8_scales;
    }

    return 0;
}